

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Vec_Int_t *
Acb_FindSupportMin(sat_solver *pSat,int iFirstDiv,Vec_Wrd_t *vPats,int *pnPats,Vec_Int_t *vSuppStart
                  )

{
  int iVar1;
  Vec_Int_t *vSupp;
  int *__dest;
  Vec_Int_t *pVVar2;
  size_t __size;
  uint iVar;
  ulong uVar3;
  
  vSupp = (Vec_Int_t *)malloc(0x10);
  iVar1 = vSuppStart->nSize;
  uVar3 = (ulong)iVar1;
  vSupp->nSize = iVar1;
  vSupp->nCap = iVar1;
  if (uVar3 == 0) {
    __size = 0;
    __dest = (int *)0x0;
  }
  else {
    __size = uVar3 << 2;
    __dest = (int *)malloc(__size);
  }
  vSupp->pArray = __dest;
  memcpy(__dest,vSuppStart->pArray,__size);
  do {
    if ((int)uVar3 < 1) {
      return vSupp;
    }
    iVar = (int)uVar3 - 1;
    uVar3 = (ulong)iVar;
    pVVar2 = Acb_FindSupportMinOne(pSat,iFirstDiv,vPats,pnPats,vSupp,iVar);
    if (vSupp != pVVar2) {
      if (vSupp->pArray != (int *)0x0) {
        free(vSupp->pArray);
      }
      free(vSupp);
    }
    vSupp = pVVar2;
  } while (pVVar2 != (Vec_Int_t *)0x0);
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Acb_FindSupportMin( sat_solver * pSat, int iFirstDiv, Vec_Wrd_t * vPats, int * pnPats, Vec_Int_t * vSuppStart )
{
    Vec_Int_t * vTemp, * vSupp = Vec_IntDup( vSuppStart ); int i;
    for ( i = Vec_IntSize(vSupp)-1; i >= 0; i-- )
    {
        vSupp = Acb_FindSupportMinOne( pSat, iFirstDiv, vPats, pnPats, vTemp = vSupp, i );
        if ( vTemp != vSupp )
            Vec_IntFree( vTemp );
        if ( vSupp == NULL )
            return NULL;
    }
    return vSupp;
}